

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O0

void __thiscall cmFLTKWrapUICommand::FinalPass(cmFLTKWrapUICommand *this)

{
  undefined8 this_00;
  __type _Var1;
  char *pcVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppcVar5;
  string *psVar6;
  string *__rhs;
  cmTargets *this_01;
  mapped_type *this_02;
  size_type local_c8;
  size_t classNum;
  size_t lastHeadersClass;
  string local_b0 [8];
  string msg_1;
  uint i;
  bool found;
  undefined1 local_68 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcs;
  allocator local_39;
  string local_38 [8];
  string msg;
  cmTarget *target;
  cmFLTKWrapUICommand *this_local;
  
  msg.field_2._8_8_ = cmMakefile::FindTarget((this->super_cmCommand).Makefile,&this->Target,false);
  if ((cmTarget *)msg.field_2._8_8_ == (cmTarget *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"FLTK_WRAP_UI was called with a target that was never created: ",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::__cxx11::string::operator+=(local_38,(string *)&this->Target);
    std::__cxx11::string::operator+=
              (local_38,".  The problem was found while processing the source directory: ");
    pcVar2 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::operator+=(local_38,pcVar2);
    std::__cxx11::string::operator+=(local_38,".  This FLTK_WRAP_UI call will be ignored.");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Message(pcVar2,"Warning");
    std::__cxx11::string::~string(local_38);
  }
  else {
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_68);
    this_00 = msg.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i,"",(allocator *)(msg_1.field_2._M_local_buf + 0xf));
    cmTarget::GetSourceFiles
              ((cmTarget *)this_00,
               (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_68,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator((allocator<char> *)(msg_1.field_2._M_local_buf + 0xf));
    msg_1.field_2._M_local_buf[0xe] = '\0';
    msg_1.field_2._8_4_ = 0;
    while( true ) {
      uVar3 = (ulong)(uint)msg_1.field_2._8_4_;
      sVar4 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::size
                        ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_68);
      if (sVar4 <= uVar3) break;
      ppcVar5 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::operator[]
                          ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_68,
                           (ulong)(uint)msg_1.field_2._8_4_);
      psVar6 = cmSourceFile::GetFullPath(*ppcVar5,(string *)0x0);
      ppcVar5 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::operator[]
                          (&this->GeneratedSourcesClasses,0);
      __rhs = cmSourceFile::GetFullPath(*ppcVar5,(string *)0x0);
      _Var1 = std::operator==(psVar6,__rhs);
      if (_Var1) {
        msg_1.field_2._M_local_buf[0xe] = '\x01';
        break;
      }
      msg_1.field_2._8_4_ = msg_1.field_2._8_4_ + 1;
    }
    if ((msg_1.field_2._M_local_buf[0xe] & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b0,
                 "In CMake 2.2 the FLTK_WRAP_UI command sets a variable to the list of source files that should be added to your executable or library. It appears that you have not added these source files to your target. You should change your CMakeLists.txt file to directly add the generated files to the target. For example FTLK_WRAP_UI(foo src1 src2 src3) will create a variable named foo_FLTK_UI_SRCS that contains the list of sources to add to your target when you call ADD_LIBRARY or ADD_EXECUTABLE. For now CMake will add the sources to your target for you as was done in CMake 2.0 and earlier. In the future this may become an error."
                 ,(allocator *)((long)&lastHeadersClass + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&lastHeadersClass + 7));
      std::__cxx11::string::operator+=
                (local_b0,"The problem was found while processing the source directory: ");
      pcVar2 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::operator+=(local_b0,pcVar2);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Message(pcVar2,"Warning");
      sVar4 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::size
                        (&this->GeneratedSourcesClasses);
      for (local_c8 = 0; local_c8 < sVar4; local_c8 = local_c8 + 1) {
        this_01 = cmMakefile::GetTargets_abi_cxx11_((this->super_cmCommand).Makefile);
        this_02 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                  ::operator[](this_01,&this->Target);
        ppcVar5 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::operator[]
                            (&this->GeneratedSourcesClasses,local_c8);
        psVar6 = cmSourceFile::GetFullPath(*ppcVar5,(string *)0x0);
        cmTarget::AddSource(this_02,psVar6);
      }
      std::__cxx11::string::~string(local_b0);
    }
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_68);
  }
  return;
}

Assistant:

void cmFLTKWrapUICommand::FinalPass()
{
  // people should add the srcs to the target themselves, but the old command
  // didn't support that, so check and see if they added the files in and if
  // they didn;t then print a warning and add then anyhow
  cmTarget* target = this->Makefile->FindTarget(this->Target);
  if(!target)
    {
    std::string msg =
      "FLTK_WRAP_UI was called with a target that was never created: ";
    msg += this->Target;
    msg +=".  The problem was found while processing the source directory: ";
    msg += this->Makefile->GetCurrentSourceDirectory();
    msg += ".  This FLTK_WRAP_UI call will be ignored.";
    cmSystemTools::Message(msg.c_str(),"Warning");
    return;
    }
  std::vector<cmSourceFile*> srcs;
  target->GetSourceFiles(srcs, "");
  bool found = false;
  for (unsigned int i = 0; i < srcs.size(); ++i)
    {
    if (srcs[i]->GetFullPath() ==
        this->GeneratedSourcesClasses[0]->GetFullPath())
      {
      found = true;
      break;
      }
    }
  if (!found)
    {
    std::string msg =
      "In CMake 2.2 the FLTK_WRAP_UI command sets a variable to the list of "
      "source files that should be added to your executable or library. It "
      "appears that you have not added these source files to your target. "
      "You should change your CMakeLists.txt file to "
      "directly add the generated files to the target. "
      "For example FTLK_WRAP_UI(foo src1 src2 src3) "
      "will create a variable named foo_FLTK_UI_SRCS that contains the list "
      "of sources to add to your target when you call ADD_LIBRARY or "
      "ADD_EXECUTABLE. For now CMake will add the sources to your target "
      "for you as was done in CMake 2.0 and earlier. In the future this may "
      "become an error.";
    msg +="The problem was found while processing the source directory: ";
    msg += this->Makefile->GetCurrentSourceDirectory();
    cmSystemTools::Message(msg.c_str(),"Warning");
    // first we add the rules for all the .fl to .h and .cxx files
    size_t lastHeadersClass = this->GeneratedSourcesClasses.size();

    // Generate code for all the .fl files
    for(size_t classNum = 0; classNum < lastHeadersClass; classNum++)
      {
      this->Makefile->GetTargets()[this->Target]
        .AddSource(this->GeneratedSourcesClasses[classNum]->GetFullPath());
      }
    }
}